

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeid.h
# Opt level: O2

string * pybind11::type_id<pybind11::str>(void)

{
  char *in_RDX;
  string *in_RDI;
  
  detail::clean_type_id_abi_cxx11_(in_RDI,(detail *)"N8pybind113strE",in_RDX);
  return in_RDI;
}

Assistant:

static std::string type_id() {
    return detail::clean_type_id(typeid(T).name());
}